

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void reed_solomon_find_modified_syndromes
               (correct_reed_solomon *rs,field_element_t *syndromes,polynomial_t error_locator,
               field_element_t *modified_syndromes)

{
  polynomial_t r;
  polynomial_t l;
  field_t field;
  field_logarithm_t *in_RDX;
  undefined8 in_RSI;
  field_element_t *in_RDI;
  field_element_t *in_R8;
  polynomial_t in_stack_00000000;
  polynomial_t modified_syndrome_poly;
  polynomial_t syndrome_poly;
  undefined4 in_stack_ffffffffffffffd4;
  
  field.log = in_RDX;
  field.exp = in_RDI;
  l._8_8_ = in_RSI;
  l.coeff = in_R8;
  r.order = (int)*(undefined8 *)(in_RDI + 0x10) + -1;
  r.coeff = (field_element_t *)in_RSI;
  r._12_4_ = in_stack_ffffffffffffffd4;
  polynomial_mul(field,l,r,in_stack_00000000);
  return;
}

Assistant:

static void reed_solomon_find_modified_syndromes(correct_reed_solomon *rs, field_element_t *syndromes, polynomial_t error_locator, field_element_t *modified_syndromes) {
    polynomial_t syndrome_poly;
    syndrome_poly.order = rs->min_distance - 1;
    syndrome_poly.coeff = syndromes;

    polynomial_t modified_syndrome_poly;
    modified_syndrome_poly.order = rs->min_distance - 1;
    modified_syndrome_poly.coeff = modified_syndromes;

    polynomial_mul(rs->field, error_locator, syndrome_poly, modified_syndrome_poly);
}